

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QRectF>::data(QList<QRectF> *this)

{
  QArrayDataPointer<QRectF> *this_00;
  QRectF *pQVar1;
  QArrayDataPointer<QRectF> *in_RDI;
  
  detach((QList<QRectF> *)0x9ae99c);
  this_00 = (QArrayDataPointer<QRectF> *)QArrayDataPointer<QRectF>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QRectF>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }